

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::LoadableStateIncrement
          (ChElementCableANCF *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv
          )

{
  element_type *peVar1;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->super_ChNodeFEAxyz + 0xa8))();
  peVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)&peVar1->super_ChNodeFEAxyz + 0xa8))(peVar1,off_x + 6,x_new,x,off_v + 6,Dv);
  return;
}

Assistant:

void ChElementCableANCF::LoadableStateIncrement(const unsigned int off_x,
                                                ChState& x_new,
                                                const ChState& x,
                                                const unsigned int off_v,
                                                const ChStateDelta& Dv) {
    nodes[0]->NodeIntStateIncrement(off_x, x_new, x, off_v, Dv);
    nodes[1]->NodeIntStateIncrement(off_x + 6, x_new, x, off_v + 6, Dv);
}